

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rate_adaptive_code.hpp
# Opt level: O2

void __thiscall
LDPC4QKD::RateAdaptiveCode<unsigned_int>::hard_decision<bool>
          (RateAdaptiveCode<unsigned_int> *this,vector<bool,_std::allocator<bool>_> *out,
          vector<double,_std::allocator<double>_> *llrs,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *msg_c)

{
  pointer pdVar1;
  pointer pvVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  _Bvector_impl *p_Var5;
  uint in_EAX;
  double *pdVar6;
  size_t j;
  ulong __n;
  double dVar7;
  _Bit_iterator __first;
  _Bit_iterator __last;
  reference rVar8;
  undefined8 uStack_28;
  
  p_Var5 = &(out->super__Bvector_base<std::allocator<bool>_>)._M_impl;
  uVar3 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_p;
  uVar4 = (p_Var5->super__Bvector_impl_data)._M_finish.super__Bit_iterator_base._M_offset;
  __last.super__Bit_iterator_base._M_offset = uVar4;
  __last.super__Bit_iterator_base._M_p = (_Bit_type *)uVar3;
  uStack_28 = (ulong)in_EAX;
  __first.super__Bit_iterator_base._8_8_ = 0;
  __first.super__Bit_iterator_base._M_p =
       (out->super__Bvector_base<std::allocator<bool>_>)._M_impl.super__Bvector_impl_data._M_start.
       super__Bit_iterator_base._M_p;
  __last.super__Bit_iterator_base._12_4_ = 0;
  std::__fill_a1<std::_Bit_iterator,int>(__first,__last,(int *)((long)&uStack_28 + 4));
  for (__n = 0; pdVar1 = (llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start,
      __n < (ulong)((long)(llrs->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)pdVar1 >> 3); __n = __n + 1) {
    pvVar2 = (msg_c->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    dVar7 = pdVar1[__n];
    for (pdVar6 = pvVar2[__n].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        pdVar6 != *(pointer *)
                   ((long)&pvVar2[__n].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data + 8); pdVar6 = pdVar6 + 1) {
      dVar7 = dVar7 + *pdVar6;
    }
    if (dVar7 < 0.0) {
      rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[](out,__n);
      *rVar8._M_p = *rVar8._M_p | rVar8._M_mask;
    }
  }
  return;
}

Assistant:

void hard_decision(
                std::vector<Bit> &out,
                const std::vector<double> &llrs,
                const std::vector<std::vector<double>> &msg_c) const {
            std::fill(out.begin(), out.end(), 0);
            for (std::size_t j{}; j < llrs.size(); ++j) {
                const double curr_sum = std::accumulate(msg_c[j].begin(), msg_c[j].end(), llrs[j]);
                if (curr_sum < 0) {
                    out[j] = 1;
                }
            }
        }